

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O3

void __thiscall A::do_comp(A *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  if (0 < this->n_) {
    iVar4 = 0;
    do {
      if (0 < this->n_) {
        pfVar1 = this->a;
        pfVar2 = this->b;
        pfVar3 = this->c;
        iVar5 = 0;
        do {
          if (0 < this->n_) {
            lVar6 = 0;
            do {
              iVar7 = this->n_ * iVar4 + iVar5;
              pfVar3[iVar7] =
                   pfVar1[(long)this->n_ * (long)iVar4 + lVar6] *
                   pfVar2[this->n_ * (int)lVar6 + iVar5] + pfVar3[iVar7];
              lVar6 = lVar6 + 1;
            } while ((int)lVar6 < this->n_);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < this->n_);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->n_);
  }
  return;
}

Assistant:

void A::do_comp() {
  for(int i = 0; i < n_; i++)
    for(int j = 0; j < n_; j++)
      for(int k = 0; k < n_; k++)
        c[i*n_+j] += a[i*n_+k] * b[k*n_+j];
}